

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O0

void __thiscall obs::safe_list<obs::slot<void_(int)>_>::iterator::unlock(iterator *this)

{
  iterator *this_local;
  
  if ((this->m_locked & 1U) != 0) {
    if (this->m_node == (node *)0x0) {
      __assert_fail("m_node",
                    "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                    ,0xf8,
                    "void obs::safe_list<obs::slot<void (int)>>::iterator::unlock() [T = obs::slot<void (int)>]"
                   );
    }
    safe_list<obs::slot<void_(int)>_>::node::unlock(this->m_node,this);
    this->m_value = (slot<void_(int)> *)0x0;
    this->m_locked = false;
    if (this->m_node->locks == 0) {
      std::condition_variable::notify_all();
    }
  }
  return;
}

Assistant:

void unlock() {
      if (!m_locked)
        return;

      assert(m_node);
      m_node->unlock(this);
      m_value = nullptr;
      m_locked = false;

      // node's locks count is zero
      if (m_node->locks == 0)
        m_list.m_delete_cv.notify_all();
    }